

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

VmConstant * GetContextValue(InstructionVMEvalContext *ctx,FunctionData *data)

{
  StackFrame *pSVar1;
  uint offset;
  StackFrame **ppSVar2;
  VmConstant *pVVar3;
  VmType type;
  
  ppSVar2 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar2;
  type = GetVmType(ctx->ctx,data->contextType);
  offset = GetArgumentOffset(data,(data->arguments).count);
  pVVar3 = LoadFrameLong(ctx,&pSVar1->stack,offset,type);
  return pVVar3;
}

Assistant:

VmConstant* GetContextValue(InstructionVMEvalContext &ctx, FunctionData *data)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	TypeBase *contextType = data->contextType;

	VmType type = GetVmType(ctx.ctx, contextType);

	unsigned offset = GetArgumentOffset(data, data->arguments.size());

	return LoadFramePointer(ctx, &frame->stack, offset, type);
}